

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_http_client_async.cpp
# Opt level: O0

void __thiscall Client::ConnectHandler(Client *this,error_code ec,endpoint *param_2)

{
  bool bVar1;
  ostream *poVar2;
  Client *local_a8;
  code *local_a0;
  undefined8 local_98;
  type local_90;
  host_name_verification local_78;
  error_code local_48 [2];
  endpoint *local_28;
  endpoint *param_2_local;
  Client *this_local;
  error_code ec_local;
  
  ec_local._0_8_ = ec.cat_;
  this_local = ec._0_8_;
  local_28 = param_2;
  param_2_local = (endpoint *)this;
  bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)&this_local);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Connect failed: ");
    boost::system::error_code::message_abi_cxx11_(local_48);
    poVar2 = std::operator<<(poVar2,(string *)local_48);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_48);
  }
  else {
    boost::asio::ssl::
    stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
    ::set_verify_mode(&this->ssl_socket_,0);
    boost::asio::ssl::host_name_verification::host_name_verification(&local_78,&this->host_);
    boost::asio::ssl::
    stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
    ::set_verify_callback<boost::asio::ssl::host_name_verification>(&this->ssl_socket_,&local_78);
    boost::asio::ssl::host_name_verification::~host_name_verification(&local_78);
    local_a0 = HandshakeHandler;
    local_98 = 0;
    local_a8 = this;
    std::bind<void(Client::*)(boost::system::error_code),Client*,std::_Placeholder<1>const&>
              (&local_90,(offset_in_Client_to_subr *)&local_a0,&local_a8,
               (_Placeholder<1> *)&std::placeholders::_1);
    boost::asio::ssl::
    stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
    ::
    async_handshake<std::_Bind<void(Client::*(Client*,std::_Placeholder<1>))(boost::system::error_code)>>
              ((stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
                *)&this->ssl_socket_,client,&local_90);
  }
  return;
}

Assistant:

void Client::ConnectHandler(boost::system::error_code ec, tcp::endpoint) {
  if (ec) {
    std::cout << "Connect failed: " << ec.message() << std::endl;
  } else {
#if SSL_VERIFY
    ssl_socket_.set_verify_mode(ssl::verify_peer);
#else
    ssl_socket_.set_verify_mode(ssl::verify_none);
#endif  // SSL_VERIFY

    // ssl::host_name_verification has been added since Boost 1.73 to replace
    // ssl::rfc2818_verification.
#if BOOST_VERSION < 107300
    ssl_socket_.set_verify_callback(ssl::rfc2818_verification(host_));
#else
    ssl_socket_.set_verify_callback(ssl::host_name_verification(host_));
#endif  // BOOST_VERSION < 107300

    // HandshakeHandler: void (boost::system::error_code)
    ssl_socket_.async_handshake(ssl::stream_base::client,
                                std::bind(&Client::HandshakeHandler,
                                this,
                                std::placeholders::_1));

  }
}